

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O3

int __thiscall dit::DeutilTests::init(DeutilTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"timer",
             "deTimer_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)deTimer_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"command_line",
             "deCommandLine_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)deCommandLine_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "timer",			"deTimer_selfTest()",		deTimer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "command_line",	"deCommandLine_selfTest()",	deCommandLine_selfTest));
	}